

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_suite.cpp
# Opt level: O0

void value_count_suite::count_null(void)

{
  undefined4 local_38c;
  basic_variable<std::allocator<char>_> local_388;
  size_type local_358;
  undefined4 local_34c;
  basic_variable<std::allocator<char>_> local_348;
  size_type local_318;
  undefined4 local_30c;
  basic_variable<std::allocator<char>_> local_308;
  size_type local_2d8;
  undefined4 local_2cc;
  size_type local_2c8;
  undefined4 local_2bc;
  basic_variable<std::allocator<char>_> local_2b8;
  size_type local_288;
  undefined4 local_27c;
  size_type local_278;
  undefined4 local_26c;
  basic_variable<std::allocator<char>_> local_268;
  size_type local_238;
  undefined4 local_22c;
  size_type local_228;
  undefined4 local_21c;
  basic_variable<std::allocator<char>_> local_218;
  size_type local_1e8;
  undefined4 local_1dc;
  size_type local_1d8;
  undefined4 local_1cc;
  basic_variable<std::allocator<char>_> local_1c8;
  size_type local_190;
  undefined4 local_184;
  double local_180;
  size_type local_178;
  undefined4 local_16c;
  basic_variable<std::allocator<char>_> local_168;
  size_type local_130 [2];
  undefined4 local_120;
  int local_11c;
  size_type local_118;
  undefined4 local_10c;
  basic_variable<std::allocator<char>_> local_108;
  size_type local_d0 [2];
  undefined4 local_c0;
  bool local_b9;
  size_type local_b8;
  undefined4 local_ac;
  basic_variable<std::allocator<char>_> local_a8;
  size_type local_70 [2];
  undefined4 local_60 [5];
  nullable local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_4c = null;
  local_48[0] = trial::dynamic::value::count<std::allocator<char>,trial::dynamic::nullable>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_4c);
  local_60[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, null)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x52,"void value_count_suite::count_null()",local_48,local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8);
  local_70[0] = trial::dynamic::value::
                count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_a8);
  local_ac = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x53,"void value_count_suite::count_null()",local_70,&local_ac);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  local_b9 = true;
  local_b8 = trial::dynamic::value::count<std::allocator<char>,bool>
                       ((basic_variable<std::allocator<char>_> *)local_38,&local_b9);
  local_c0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, true)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x54,"void value_count_suite::count_null()",&local_b8,&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_108,true);
  local_d0[0] = trial::dynamic::value::
                count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>_> *)local_38,&local_108);
  local_10c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(true))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x55,"void value_count_suite::count_null()",local_d0,&local_10c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_108);
  local_11c = 2;
  local_118 = trial::dynamic::value::count<std::allocator<char>,int>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_11c);
  local_120 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 2)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x56,"void value_count_suite::count_null()",&local_118,&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  local_130[0] = trial::dynamic::value::
                 count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>_> *)local_38,&local_168);
  local_16c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(2))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x57,"void value_count_suite::count_null()",local_130,&local_16c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_168);
  local_180 = 3.0;
  local_178 = trial::dynamic::value::count<std::allocator<char>,double>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_180);
  local_184 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, 3.0)","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x58,"void value_count_suite::count_null()",&local_178,&local_184);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_1c8,3.0);
  local_190 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_1c8);
  local_1cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(3.0))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x59,"void value_count_suite::count_null()",&local_190,&local_1cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  local_1d8 = trial::dynamic::value::count<std::allocator<char>,char[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(char (*) [6])"alpha");
  local_1dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, \"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x5a,"void value_count_suite::count_null()",&local_1d8,&local_1dc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_218,"alpha");
  local_1e8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_218);
  local_21c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x5b,"void value_count_suite::count_null()",&local_1e8,&local_21c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  local_228 = trial::dynamic::value::count<std::allocator<char>,wchar_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,(wchar_t (*) [6])L"alpha"
                        );
  local_22c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, L\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x5c,"void value_count_suite::count_null()",&local_228,&local_22c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_268,L"alpha");
  local_238 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_268);
  local_26c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(L\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x5d,"void value_count_suite::count_null()",&local_238,&local_26c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_268);
  local_278 = trial::dynamic::value::count<std::allocator<char>,char16_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,
                         (char16_t (*) [6])L"alpha");
  local_27c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, u\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x5e,"void value_count_suite::count_null()",&local_278,&local_27c);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2b8,L"alpha");
  local_288 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_2b8);
  local_2bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(u\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x5f,"void value_count_suite::count_null()",&local_288,&local_2bc);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  local_2c8 = trial::dynamic::value::count<std::allocator<char>,char32_t[6]>
                        ((basic_variable<std::allocator<char>_> *)local_38,
                         (char32_t (*) [6])L"alpha");
  local_2cc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, U\"alpha\")","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x60,"void value_count_suite::count_null()",&local_2c8,&local_2cc);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_308,L"alpha");
  local_2d8 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_308);
  local_30c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, variable(U\"alpha\"))","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x61,"void value_count_suite::count_null()",&local_2d8,&local_30c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_308);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_318 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_348);
  local_34c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, array::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,0x62,"void value_count_suite::count_null()",&local_318,&local_34c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_348);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_358 = trial::dynamic::value::
              count<std::allocator<char>,trial::dynamic::basic_variable<std::allocator<char>>>
                        ((basic_variable<std::allocator<char>_> *)local_38,&local_388);
  local_38c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("value::count(data, map::make())","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/algorithm/count_suite.cpp"
             ,99,"void value_count_suite::count_null()",&local_358,&local_38c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void count_null()
{
    // Null is always empty
    variable data;

    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, null), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, true), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(true)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 2), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(2)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, 3.0), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(3.0)), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, "alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable("alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, L"alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(L"alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, u"alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(u"alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, U"alpha"), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, variable(U"alpha")), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, array::make()), 0);
    TRIAL_PROTOCOL_TEST_EQUAL(value::count(data, map::make()), 0);
}